

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

void __thiscall FIX::FileStore::setSeqNum(FileStore *this)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  int iVar3;
  IOException *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_3d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  FileStore *local_10;
  FileStore *this_local;
  
  local_10 = this;
  rewind((FILE *)this->m_seqNumsFile);
  __stream = (FILE *)this->m_seqNumsFile;
  uVar1 = (*(this->super_MessageStore)._vptr_MessageStore[4])();
  uVar2 = (*(this->super_MessageStore)._vptr_MessageStore[5])();
  fprintf(__stream,"%10.10d : %10.10d",(ulong)uVar1,(ulong)uVar2);
  iVar3 = ferror((FILE *)this->m_seqNumsFile);
  if (iVar3 != 0) {
    local_3d = 1;
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_30,"Unable to write to file ",&this->m_seqNumsFileName);
    IOException::IOException(pIVar4,&local_30);
    local_3d = 0;
    __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
  }
  iVar3 = fflush((FILE *)this->m_seqNumsFile);
  if (iVar3 != 0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_60,"Unable to flush file ",&this->m_seqNumsFileName);
    IOException::IOException(pIVar4,&local_60);
    __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
  }
  return;
}

Assistant:

void FileStore::setSeqNum()
{
  rewind( m_seqNumsFile );
  fprintf( m_seqNumsFile, "%10.10d : %10.10d",
           getNextSenderMsgSeqNum(), getNextTargetMsgSeqNum() );
  if ( ferror( m_seqNumsFile ) )
    throw IOException( "Unable to write to file " + m_seqNumsFileName );
  if ( fflush( m_seqNumsFile ) )
    throw IOException( "Unable to flush file " + m_seqNumsFileName );
}